

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XIncludeLocation.cpp
# Opt level: O3

XMLCh * __thiscall
xercesc_4_0::XIncludeLocation::prependPath(XIncludeLocation *this,XMLCh *baseToAdd)

{
  short *psVar1;
  int iVar2;
  int iVar3;
  XMLCh *src;
  long lVar4;
  undefined4 extraout_var;
  ulong uVar5;
  XMLCh *target;
  
  if (this->fHref != (XMLCh *)0x0) {
    if (baseToAdd == (XMLCh *)0x0) {
      return this->fHref;
    }
    XMLPlatformUtils::removeDotDotSlash(baseToAdd,XMLPlatformUtils::fgMemoryManager);
    uVar5 = 0;
    do {
      psVar1 = (short *)((long)baseToAdd + uVar5);
      uVar5 = uVar5 + 2;
    } while (*psVar1 != 0);
    lVar4 = 0;
    do {
      psVar1 = (short *)((long)baseToAdd + lVar4);
      lVar4 = lVar4 + 2;
    } while (*psVar1 != 0);
    iVar2 = XMLString::lastIndexOf(L'/',baseToAdd,(lVar4 >> 1) - 1);
    if (iVar2 == -1) {
      lVar4 = 0;
      do {
        psVar1 = (short *)((long)baseToAdd + lVar4);
        lVar4 = lVar4 + 2;
      } while (*psVar1 != 0);
      iVar2 = XMLString::lastIndexOf(L'\\',baseToAdd,(lVar4 >> 1) - 1);
    }
    src = findEndOfProtocol(this->fHref);
    if (src == (XMLCh *)0x0) {
      lVar4 = 0;
    }
    else {
      lVar4 = 0;
      do {
        psVar1 = (short *)((long)src + lVar4);
        lVar4 = lVar4 + 2;
      } while (*psVar1 != 0);
      lVar4 = (lVar4 >> 1) + -1;
    }
    iVar3 = (*XMLPlatformUtils::fgMemoryManager->_vptr_MemoryManager[3])
                      (XMLPlatformUtils::fgMemoryManager,
                       ((uVar5 >> 1) + 0x7fffffffffffffff + lVar4) * 2 + 4);
    target = (XMLCh *)CONCAT44(extraout_var,iVar3);
    if (target != (XMLCh *)0x0) {
      XMLString::copyNString(target,baseToAdd,(long)iVar2 + 1);
      target[(long)iVar2 + 1] = L'\0';
      XMLString::catString(target,src);
      if (this->fHref != (XMLCh *)0x0) {
        (*XMLPlatformUtils::fgMemoryManager->_vptr_MemoryManager[4])();
      }
      this->fHref = target;
      return target;
    }
  }
  return (XMLCh *)0x0;
}

Assistant:

const XMLCh *
XIncludeLocation::prependPath(const XMLCh *baseToAdd){
    XMLCh *relativeHref = NULL;
    if (fHref == NULL){
        return NULL;
    }

    if (baseToAdd == NULL){
        return fHref;
    }

    XMLPlatformUtils::removeDotDotSlash((XMLCh*)baseToAdd);
    XMLSize_t baseLength = XMLString::stringLen(baseToAdd);

    int lastSlash = XMLString::lastIndexOf(baseToAdd, chForwardSlash);
    if (lastSlash == -1){
        /* not found, try another platform */
        lastSlash = XMLString::lastIndexOf(baseToAdd, chBackSlash);
    }

    // Skip the scheme (e.g., file://) if fHref has one. Ideally we
    // should detect also if the URI is absolute.
    //
    const XMLCh* hrefPath = findEndOfProtocol (fHref);
    XMLSize_t hrefPathLength = XMLString::stringLen(hrefPath);

    relativeHref = (XMLCh *)XMLPlatformUtils::fgMemoryManager->allocate((hrefPathLength + baseLength + 2) * sizeof(XMLCh));
    if (relativeHref == NULL){
        return NULL;
    }
    XMLString::copyNString(relativeHref, baseToAdd, lastSlash + 1);
    relativeHref[lastSlash + 1] = chNull;
    XMLString::catString(relativeHref, hrefPath);

    /* free the old reference */
    deallocate((void *)fHref);

    fHref = relativeHref;
    return fHref;
}